

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

void __thiscall color<unsigned_char,_2U>::normalize(color<unsigned_char,_2U> *this)

{
  vec3<unsigned_char> local_20;
  
  local_20.super_vec3_base.r = (float)((ushort)(this->field_0).field_1 & 0xff);
  local_20.super_vec3_base.g = (float)(this->field_0).field_1.g;
  local_20.super_vec3_base.b = 127.5;
  vec3<unsigned_char>::normalize(&local_20);
  (this->field_0).comps[0] = (uchar)(int)local_20.super_vec3_base.r;
  (this->field_0).comps[1] = (uchar)(int)local_20.super_vec3_base.g;
  return;
}

Assistant:

void normalize() {
        vec3<componentType> v((float)r, (float)g,
                              (float)gc_s[sizeof(componentType)] * 0.5f);
        v.normalize();
        r = (componentType)v.r;
        g = (componentType)v.g;
    }